

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,hiberlite::bean_ptr<B>>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_> *v,
               uint param_3)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  body;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  local_100;
  stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  local_b8;
  string local_90;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  local_70;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"items","");
  local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>.res =
       (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0;
  local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001d4440;
  local_b8.it._M_current =
       (v->super__Vector_base<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.ct = v;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  ::collection_nvp(&local_70,&local_90,&local_b8);
  local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001d4488;
  if (local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>.res !=
      (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
    piVar1 = &(local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_b8.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->_vptr_shared_cnt_obj_pair[1])
                ();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  paVar2 = &local_100.name.field_2;
  local_100.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_70.name._M_dataplus._M_p,
             local_70.name._M_dataplus._M_p + local_70.name._M_string_length);
  local_100.stream.ct = local_70.stream.ct;
  local_100.stream.it._M_current = local_70.stream.it._M_current;
  local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res =
       local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res;
  if (local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res !=
      (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
    (local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount =
         (local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount + 1;
  }
  local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001d4440;
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_100);
  local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001d4488;
  if (local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res !=
      (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
    piVar1 = &(local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_100.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->
        _vptr_shared_cnt_obj_pair[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.name._M_dataplus._M_p);
  }
  local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001d4488;
  if (local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res !=
      (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0) {
    piVar1 = &(local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_70.stream.xx.super_shared_res<hiberlite::real_bean<B>_>.res)->
        _vptr_shared_cnt_obj_pair[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}